

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void GPU_RemoveWindowMapping(Uint32 windowID)

{
  int local_10;
  int num_to_move;
  int i;
  Uint32 windowID_local;
  
  if (_gpu_window_mappings == (GPU_WindowMapping *)0x0) {
    gpu_init_window_mappings();
  }
  if (windowID != 0) {
    for (local_10 = 0; local_10 < _gpu_num_window_mappings; local_10 = local_10 + 1) {
      if (_gpu_window_mappings[local_10].windowID == windowID) {
        (_gpu_window_mappings[local_10].target)->context->windowID = 0;
        _gpu_num_window_mappings = _gpu_num_window_mappings + -1;
        if (_gpu_num_window_mappings - local_10 < 1) {
          return;
        }
        memmove(_gpu_window_mappings + local_10,_gpu_window_mappings + (local_10 + 1),
                (long)(_gpu_num_window_mappings - local_10) << 4);
        return;
      }
    }
  }
  return;
}

Assistant:

void GPU_RemoveWindowMapping(Uint32 windowID)
{
    int i;

    if(_gpu_window_mappings == NULL)
        gpu_init_window_mappings();

    if(windowID == 0)  // Invalid window ID
        return;

    // Find the occurrence
    for(i = 0; i < _gpu_num_window_mappings; i++)
    {
        if(_gpu_window_mappings[i].windowID == windowID)
        {
            int num_to_move;

            // Unset the target's window
            _gpu_window_mappings[i].target->context->windowID = 0;

            // Move the remaining entries to replace the removed one
            _gpu_num_window_mappings--;
            num_to_move = _gpu_num_window_mappings - i;
            if(num_to_move > 0)
                memmove(&_gpu_window_mappings[i], &_gpu_window_mappings[i+1], num_to_move * sizeof(GPU_WindowMapping));
            return;
        }
    }

}